

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scaler.pb.cc
# Opt level: O2

void __thiscall CoreML::Specification::Scaler::InternalSwap(Scaler *this,Scaler *other)

{
  intptr_t iVar1;
  
  iVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  (this->super_MessageLite)._internal_metadata_.ptr_ =
       (other->super_MessageLite)._internal_metadata_.ptr_;
  (other->super_MessageLite)._internal_metadata_.ptr_ = iVar1;
  google::protobuf::RepeatedField<double>::InternalSwap(&this->shiftvalue_,&other->shiftvalue_);
  google::protobuf::RepeatedField<double>::InternalSwap(&this->scalevalue_,&other->scalevalue_);
  return;
}

Assistant:

void Scaler::InternalSwap(Scaler* other) {
  using std::swap;
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  shiftvalue_.InternalSwap(&other->shiftvalue_);
  scalevalue_.InternalSwap(&other->scalevalue_);
}